

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O3

int mbedtls_cipher_cmac_finish(mbedtls_cipher_context_t *ctx,uchar *output)

{
  uchar *buf;
  mbedtls_cmac_context_t *input;
  int iVar1;
  size_t j;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  size_t ilen_00;
  size_t local_78;
  size_t olen;
  ulong local_68;
  uchar K2 [16];
  uchar K1 [16];
  uchar M_last [16];
  ulong ilen;
  
  iVar1 = -0x6100;
  if (((ctx != (mbedtls_cipher_context_t *)0x0) &&
      (ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) &&
     (input = ctx->cmac_ctx, output != (uchar *)0x0 && input != (mbedtls_cmac_context_t *)0x0)) {
    uVar5 = *(uint *)&ctx->cipher_info->field_0x8 & 0x1f;
    ilen = (ulong)uVar5;
    olen = (size_t)output;
    mbedtls_platform_zeroize(K2 + 8,0x10);
    mbedtls_platform_zeroize(&local_68,0x10);
    mbedtls_platform_zeroize(K1 + 8,0x10);
    if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
      ilen_00 = 0;
    }
    else {
      ilen_00 = (size_t)(*(uint *)&ctx->cipher_info->field_0x8 & 0x1f);
    }
    iVar1 = mbedtls_cipher_update(ctx,K1 + 8,ilen_00,K1 + 8,&local_78);
    if ((iVar1 == 0) && (iVar1 = cmac_multiply_by_u(K2 + 8,K1 + 8,ilen_00), iVar1 == 0)) {
      cmac_multiply_by_u((uchar *)&local_68,K2 + 8,ilen_00);
    }
    mbedtls_platform_zeroize(K1 + 8,0x10);
    buf = input->unprocessed_block;
    uVar3 = input->unprocessed_len;
    if (uVar3 < ilen) {
      uVar2 = 0;
      do {
        if (uVar2 < uVar3) {
          K1[uVar2 + 8] = buf[uVar2];
        }
        else if (uVar2 == uVar3) {
          K1[uVar3 + 8] = 0x80;
        }
        else {
          K1[uVar2 + 8] = '\0';
        }
        uVar2 = uVar2 + 1;
      } while (ilen != uVar2);
      if (uVar5 < 8) {
        uVar2 = 0;
      }
      else {
        uVar3 = 0;
        do {
          *(ulong *)(K1 + uVar3 + 8) = *(ulong *)(K1 + uVar3 + 8) ^ *(ulong *)(K2 + (uVar3 - 8));
          uVar2 = uVar3 + 8;
          uVar4 = uVar3 + 0x10;
          uVar3 = uVar2;
        } while (uVar4 <= ilen);
      }
      if (uVar2 < ilen) {
        do {
          K1[uVar2 + 8] = K1[uVar2 + 8] ^ K2[uVar2 - 8];
          uVar2 = uVar2 + 1;
        } while (ilen != uVar2);
      }
    }
    else {
      if (uVar5 < 8) {
        uVar2 = 0;
      }
      else {
        uVar3 = 0;
        do {
          *(ulong *)(K1 + uVar3 + 8) = *(ulong *)(K2 + uVar3 + 8) ^ *(ulong *)(buf + uVar3);
          uVar2 = uVar3 + 8;
          uVar4 = uVar3 + 0x10;
          uVar3 = uVar2;
        } while (uVar4 <= ilen);
      }
      if (uVar2 < ilen) {
        do {
          K1[uVar2 + 8] = K2[uVar2 + 8] ^ buf[uVar2];
          uVar2 = uVar2 + 1;
        } while (ilen != uVar2);
      }
    }
    if (uVar5 < 8) {
      uVar2 = 0;
    }
    else {
      uVar3 = 0;
      do {
        *(ulong *)(input->state + uVar3) =
             *(ulong *)(input->state + uVar3) ^ *(ulong *)(K1 + uVar3 + 8);
        uVar2 = uVar3 + 8;
        uVar4 = uVar3 + 0x10;
        uVar3 = uVar2;
      } while (uVar4 <= ilen);
    }
    if (uVar2 < ilen) {
      do {
        input->state[uVar2] = input->state[uVar2] ^ K1[uVar2 + 8];
        uVar2 = uVar2 + 1;
      } while (ilen != uVar2);
    }
    iVar1 = mbedtls_cipher_update(ctx,input->state,ilen,input->state,&local_78);
    if (iVar1 == 0) {
      memcpy((void *)olen,input,ilen);
    }
    mbedtls_platform_zeroize(K2 + 8,0x10);
    mbedtls_platform_zeroize(&local_68,0x10);
    input->unprocessed_len = 0;
    mbedtls_platform_zeroize(buf,0x10);
    mbedtls_platform_zeroize(input,0x10);
  }
  return iVar1;
}

Assistant:

int mbedtls_cipher_cmac_finish(mbedtls_cipher_context_t *ctx,
                               unsigned char *output)
{
    mbedtls_cmac_context_t *cmac_ctx;
    unsigned char *state, *last_block;
    unsigned char K1[MBEDTLS_CMAC_MAX_BLOCK_SIZE];
    unsigned char K2[MBEDTLS_CMAC_MAX_BLOCK_SIZE];
    unsigned char M_last[MBEDTLS_CMAC_MAX_BLOCK_SIZE];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen, block_size;

    if (ctx == NULL || ctx->cipher_info == NULL || ctx->cmac_ctx == NULL ||
        output == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    cmac_ctx = ctx->cmac_ctx;
    block_size = mbedtls_cipher_info_get_block_size(ctx->cipher_info);
    state = cmac_ctx->state;

    mbedtls_platform_zeroize(K1, sizeof(K1));
    mbedtls_platform_zeroize(K2, sizeof(K2));
    cmac_generate_subkeys(ctx, K1, K2);

    last_block = cmac_ctx->unprocessed_block;

    /* Calculate last block */
    if (cmac_ctx->unprocessed_len < block_size) {
        cmac_pad(M_last, block_size, last_block, cmac_ctx->unprocessed_len);
        mbedtls_xor(M_last, M_last, K2, block_size);
    } else {
        /* Last block is complete block */
        mbedtls_xor(M_last, last_block, K1, block_size);
    }


    mbedtls_xor(state, M_last, state, block_size);
    if ((ret = mbedtls_cipher_update(ctx, state, block_size, state,
                                     &olen)) != 0) {
        goto exit;
    }

    memcpy(output, state, block_size);

exit:
    /* Wipe the generated keys on the stack, and any other transients to avoid
     * side channel leakage */
    mbedtls_platform_zeroize(K1, sizeof(K1));
    mbedtls_platform_zeroize(K2, sizeof(K2));

    cmac_ctx->unprocessed_len = 0;
    mbedtls_platform_zeroize(cmac_ctx->unprocessed_block,
                             sizeof(cmac_ctx->unprocessed_block));

    mbedtls_platform_zeroize(state, MBEDTLS_CMAC_MAX_BLOCK_SIZE);
    return ret;
}